

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::ideal_spacing(Fl_Widget_Type *this,int *x,int *y)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (this->o->label_).size;
  iVar2 = (uint)(0xd < uVar1) * 5 + 5;
  if ((int)uVar1 < 10) {
    iVar2 = 0;
  }
  *y = iVar2;
  *x = iVar2;
  return;
}

Assistant:

void
Fl_Widget_Type::ideal_spacing(int &x, int &y) {
  if (o->labelsize() < 10)
    x = y = 0;
  else if (o->labelsize() < 14)
    x = y = 5;
  else
    x = y = 10;
}